

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O1

void transstring(string_view *beast_str,string *shine_str)

{
  ostream *poVar1;
  stringstream sstr;
  long local_1a0 [2];
  basic_ostream<char,_std::char_traits<char>_> local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a0);
  std::ios::clear((int)(stringstream *)local_1a0 + (int)*(undefined8 *)(local_1a0[0] + -0x18));
  boost::io::ostream_put<char,std::char_traits<char>>(local_190,beast_str->ptr_,beast_str->len_);
  std::operator>>((istream *)local_1a0,(string *)shine_str);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Here:",5);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(shine_str->super_string)._M_dataplus._M_p,
                      (shine_str->super_string)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

void transstring(beast::string_view &beast_str, shine::string &shine_str) {
    stringstream sstr;
    sstr.clear();
    sstr << beast_str;
    sstr >> shine_str;
    std::cout << "Here:" << shine_str << std::endl;
}